

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cc
# Opt level: O2

string * __thiscall
re2::FormatMode_abi_cxx11_(string *__return_storage_ptr__,re2 *this,ParseFlags flags)

{
  long lVar1;
  long lVar2;
  
  lVar1 = 0;
  do {
    lVar2 = lVar1;
    if (lVar2 + 0x28 == 0xf0) {
      StringPrintf_abi_cxx11_(__return_storage_ptr__,"%#x");
      return __return_storage_ptr__;
    }
    lVar1 = lVar2 + 0x28;
  } while (*(int *)((long)&parse_modes + lVar2) != (int)this);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(&DAT_0015e458 + lVar2));
  return __return_storage_ptr__;
}

Assistant:

static string FormatMode(Regexp::ParseFlags flags) {
  for (int i = 0; i < arraysize(parse_modes); i++)
    if (parse_modes[i].parse_flags == flags)
      return parse_modes[i].desc;
  return StringPrintf("%#x", static_cast<uint>(flags));
}